

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O1

void __thiscall
QHttpNetworkConnectionPrivate::QHttpNetworkConnectionPrivate
          (QHttpNetworkConnectionPrivate *this,quint16 connectionCount,QString *hostName,
          quint16 port,bool encrypt,bool isLocalSocket,ConnectionType type)

{
  Data *pDVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  QHttpNetworkConnectionChannel *this_00;
  long in_FS_OFFSET;
  QString local_98;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QObjectPrivate::QObjectPrivate(&this->super_QObjectPrivate,QObjectPrivateVersion);
  *(undefined ***)this = &PTR__QHttpNetworkConnectionPrivate_002d36e0;
  this->state = RunningState;
  this->networkLayerState = Unknown;
  pDVar1 = (hostName->d).d;
  (this->hostName).d.d = pDVar1;
  (this->hostName).d.ptr = (hostName->d).ptr;
  (this->hostName).d.size = (hostName->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this->port = port;
  this->encrypt = encrypt;
  this->isLocalSocket = isLocalSocket;
  uVar6 = 1;
  if (1 < type - ConnectionTypeHTTP2) {
    uVar6 = (uint)connectionCount;
  }
  this->delayIpv4 = true;
  this->activeChannelCount = uVar6;
  this->channelCount = (uint)connectionCount;
  QTimer::QTimer(&this->delayedConnectionTimer,(QObject *)0x0);
  uVar8 = (ulong)this->channelCount;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar8;
  uVar3 = SUB168(auVar2 * ZEXT816(0x108),0);
  uVar4 = uVar3 + 8;
  if (0xfffffffffffffff7 < uVar3) {
    uVar4 = 0xffffffffffffffff;
  }
  uVar3 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x108),8) == 0) {
    uVar3 = uVar4;
  }
  puVar5 = (ulong *)operator_new__(uVar3);
  *puVar5 = uVar8;
  if (uVar8 != 0) {
    lVar7 = uVar8 * 0x108;
    this_00 = (QHttpNetworkConnectionChannel *)(puVar5 + 1);
    do {
      QHttpNetworkConnectionChannel::QHttpNetworkConnectionChannel
                ((QHttpNetworkConnectionChannel *)this_00);
      this_00 = this_00 + 1;
      lVar7 = lVar7 + -0x108;
    } while (lVar7 != 0);
  }
  this->channels = (QHttpNetworkConnectionChannel *)(puVar5 + 1);
  local_58.d.size = 0;
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_78.d.size = 0;
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (char16_t *)0x0;
  local_98.d.size = 0;
  local_98.d.d = (Data *)0x0;
  local_98.d.ptr = (char16_t *)0x0;
  QNetworkProxy::QNetworkProxy(&this->networkProxy,NoProxy,&local_58,0,&local_78,&local_98);
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  (this->lowPriorityQueue).d.ptr = (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)0x0;
  (this->lowPriorityQueue).d.size = 0;
  (this->highPriorityQueue).d.size = 0;
  (this->lowPriorityQueue).d.d = (Data *)0x0;
  (this->highPriorityQueue).d.d = (Data *)0x0;
  (this->highPriorityQueue).d.ptr = (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)0x0;
  this->preConnectRequests = 0;
  this->connectionType = type;
  (this->sslContext).super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->sslContext).super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QHttp2Configuration::QHttp2Configuration(&this->http2Parameters);
  (this->peerVerifyName).d.d = (Data *)0x0;
  (this->peerVerifyName).d.ptr = (char16_t *)0x0;
  (this->peerVerifyName).d.size = 0;
  QNetworkConnectionMonitor::QNetworkConnectionMonitor(&this->connectionMonitor);
  if (isLocalSocket) {
    this->networkLayerState = IPv4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QHttpNetworkConnectionPrivate::QHttpNetworkConnectionPrivate(
        quint16 connectionCount, const QString &hostName, quint16 port, bool encrypt,
        bool isLocalSocket, QHttpNetworkConnection::ConnectionType type)
    : hostName(hostName),
      port(port),
      encrypt(encrypt),
      isLocalSocket(isLocalSocket),
      activeChannelCount(getPreferredActiveChannelCount(type, connectionCount)),
      channelCount(connectionCount),
      channels(new QHttpNetworkConnectionChannel[channelCount]),
#ifndef QT_NO_NETWORKPROXY
      networkProxy(QNetworkProxy::NoProxy),
#endif
      connectionType(type)
{
    if (isLocalSocket) // Don't try to do host lookup for local sockets
        networkLayerState = IPv4;
    // We allocate all 6 channels even if it's an HTTP/2-enabled
    // connection: in case the protocol negotiation via NPN/ALPN fails,
    // we will have normally working HTTP/1.1.
    Q_ASSERT(channelCount >= activeChannelCount);
}